

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccelerometerSensor.cpp
# Opt level: O1

AccelerometerSensor * __thiscall
iDynTree::AccelerometerSensor::operator=(AccelerometerSensor *this,AccelerometerSensor *other)

{
  AccelerometerPrivateAttributes *pAVar1;
  AccelerometerPrivateAttributes *pAVar2;
  
  if (this != other) {
    pAVar1 = other->pimpl;
    pAVar2 = this->pimpl;
    std::__cxx11::string::_M_assign((string *)pAVar2);
    iDynTree::Transform::operator=(&pAVar2->link_H_sensor,&pAVar1->link_H_sensor);
    pAVar2->parent_link_index = pAVar1->parent_link_index;
    std::__cxx11::string::_M_assign((string *)&pAVar2->parent_link_name);
  }
  return this;
}

Assistant:

AccelerometerSensor& AccelerometerSensor::operator=(const AccelerometerSensor& other)
{
    if(this != &other)
    {
        *pimpl = *(other.pimpl);
    }
    return *this;
}